

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

Publication * __thiscall
helics::ValueFederateManager::getPublication(ValueFederateManager *this,string_view key)

{
  int iVar1;
  Publication **ppPVar2;
  Publication *pPVar3;
  BlockIterator<helics::Publication,_32,_helics::Publication_**> pubF;
  handle pubHandle;
  BlockIterator<helics::Publication,_32,_helics::Publication_**> local_48;
  handle local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_30,&this->publications);
  gmlc::containers::
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
  find(&local_48,local_30.data,key);
  iVar1 = ((local_30.data)->dataStorage).bsize;
  ppPVar2 = ((local_30.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppPVar2 == (Publication **)0x0) {
      ppPVar2 = &gmlc::containers::
                 StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::
                 end::emptyValue;
    }
    else {
      ppPVar2 = ppPVar2 + (long)((local_30.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppPVar2 = ppPVar2 + ((local_30.data)->dataStorage).dataSlotIndex;
  }
  pPVar3 = local_48.ptr;
  if (((ppPVar2 == local_48.vec) ||
      ((((local_48.vec != (Publication **)0x0 && (ppPVar2 != (Publication **)0x0)) &&
        (*local_48.vec == (Publication *)0x0)) && (*ppPVar2 == (Publication *)0x0)))) &&
     (iVar1 == local_48.offset)) {
    pPVar3 = (Publication *)invalidPubNC;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
  return pPVar3;
}

Assistant:

Publication& ValueFederateManager::getPublication(std::string_view key)
{
    auto pubHandle = publications.lock();
    auto pubF = pubHandle->find(key);
    if (pubF != pubHandle->end()) {
        return *pubF;
    }
    return invalidPubNC;
}